

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O2

size_t __thiscall Messages::Person::ByteSizeLong(Person *this)

{
  Rep *pRVar1;
  size_t sVar2;
  size_t sVar3;
  void **ppvVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  if ((~(this->_has_bits_).has_bits_[0] & 5) == 0) {
    sVar2 = google::protobuf::internal::WireFormatLite::StringSize((this->name_).ptr_);
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->id_);
    sVar2 = sVar2 + sVar3 + 2;
  }
  else {
    sVar2 = RequiredFieldsByteSizeFallback(this);
  }
  lVar7 = (long)(this->phones_).super_RepeatedPtrFieldBase.current_size_;
  uVar6 = sVar2 + lVar7;
  pRVar1 = (this->phones_).super_RepeatedPtrFieldBase.rep_;
  ppvVar4 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar4 = (void **)0x0;
  }
  for (lVar5 = 0; lVar7 * 8 != lVar5; lVar5 = lVar5 + 8) {
    sVar2 = google::protobuf::internal::WireFormatLite::MessageSize<Messages::Person_PhoneNumber>
                      (*(Person_PhoneNumber **)((long)ppvVar4 + lVar5));
    uVar6 = uVar6 + sVar2;
  }
  if (((this->_has_bits_).has_bits_[0] & 2) != 0) {
    sVar2 = google::protobuf::internal::WireFormatLite::StringSize((this->email_).ptr_);
    uVar6 = uVar6 + sVar2 + 1;
  }
  if ((this->field_0x8 & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)uVar6;
    return uVar6;
  }
  sVar2 = google::protobuf::internal::ComputeUnknownFieldsSize
                    ((InternalMetadata *)&this->field_0x8,uVar6,&this->_cached_size_);
  return sVar2;
}

Assistant:

size_t Person::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:Messages.Person)
  size_t total_size = 0;

  if (((_has_bits_[0] & 0x00000005) ^ 0x00000005) == 0) {  // All required fields are present.
    // required string name = 1;
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_name());

    // required int32 id = 2;
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
        this->_internal_id());

  } else {
    total_size += RequiredFieldsByteSizeFallback();
  }
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .Messages.Person.PhoneNumber phones = 4;
  total_size += 1UL * this->_internal_phones_size();
  for (const auto& msg : this->phones_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // optional string email = 3;
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000002u) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_email());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}